

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O3

unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> __thiscall
qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
          (pl *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  Pipeline *this_00;
  undefined8 *puVar1;
  pointer *__ptr;
  pointer __p;
  String *local_28;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_20;
  
  this_00 = (Pipeline *)operator_new(0x38);
  Pipeline::Pipeline(this_00,"",(Pipeline *)0x0);
  this_00->_vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ee3b8;
  this_00[1]._vptr_Pipeline = (_func_int **)args;
  local_28 = (String *)this_00;
  puVar1 = (undefined8 *)operator_new(0x10);
  local_28 = (String *)0x0;
  *puVar1 = 0;
  local_20._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
       (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
  puVar1[1] = this_00;
  *(undefined8 **)this = puVar1;
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_20);
  if (local_28 != (String *)0x0) {
    std::default_delete<qpdf::pl::String>::operator()
              ((default_delete<qpdf::pl::String> *)&local_28,local_28);
  }
  return (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Link>
    create(Args&&... args)
    {
        return std::make_unique<Link>(
            nullptr, std::make_unique<P>("", nullptr, std::forward<Args>(args)...));
    }